

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O2

void anon_unknown.dwarf_3d9e::FloatCase(void)

{
  char *expected;
  string actual;
  string f;
  allocator local_71;
  char *local_70;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Real Number: %.2f",(allocator *)&local_68);
  GPIO::format<float>(&local_68,&local_28,3.141592);
  local_70 = "Real Number: 3.14";
  std::__cxx11::string::string((string *)&local_48,"",&local_71);
  assert::are_equal<char_const*,std::__cxx11::string>(&local_70,&local_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void FloatCase()
    {
        std::string f = "Real Number: %.2f";
        auto actual = GPIO::format(f, 3.141592f);
        auto expected = "Real Number: 3.14";

        assert::are_equal(expected, actual);
    }